

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Record.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  string local_3a0;
  string str;
  string local_360;
  Record rec;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &str.field_2;
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"frames/100/log.txt","");
  gtar::Record::Record(&rec,&str);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"log.txt","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"100","");
  bVar3 = check(&rec,&local_50,&local_70,&local_90,Discrete,UInt8,Text,true,0x2f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar4 = checkstr(&local_360,&local_3a0,true,0x30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_360.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != paVar1) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"frames/100/log.txt","");
  gtar::Record::Record(&rec,&str);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"lo.txt","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"100","");
  bVar5 = check(&rec,&local_b0,&local_d0,&local_f0,Discrete,UInt8,Text,false,0x36);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar6 = checkstr(&local_360,&local_3a0,true,0x37);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != paVar1) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"frames/100/position.f32.ind","");
  gtar::Record::Record(&rec,&str);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"position","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"100","");
  bVar7 = check(&rec,&local_110,&local_130,&local_150,Discrete,Float32,Individual,true,0x3d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar8 = checkstr(&local_360,&local_3a0,true,0x3e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != paVar1) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"velocity.u64.uni","");
  gtar::Record::Record(&rec,&str);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"velocity","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  bVar9 = check(&rec,&local_170,&local_190,&local_1b0,Constant,UInt64,Uniform,true,0x44);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar10 = checkstr(&local_360,&local_3a0,true,0x45);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != paVar1) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"/vars/stdout.txt/12","");
  gtar::Record::Record(&rec,&str);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"stdout.txt","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"12","");
  bVar11 = check(&rec,&local_1d0,&local_1f0,&local_210,Continuous,UInt8,Text,true,0x4b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar12 = checkstr(&local_360,&local_3a0,true,0x4c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != paVar1) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&str,"/rigid_body/frames/0/angular_momentum.f64.ind","");
  gtar::Record::Record(&rec,&str);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"rigid_body","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"angular_momentum","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"0","");
  bVar13 = check(&rec,&local_230,&local_250,&local_270,Discrete,Float64,Individual,true,0x52);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar14 = checkstr(&local_360,&local_3a0,true,0x53);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != paVar1) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,"frame/2000/position.f32.ind","");
  gtar::Record::Record(&rec,&str);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"frame/2000","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"position","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  bVar15 = check(&rec,&local_290,&local_2b0,&local_2d0,Constant,Float32,Individual,true,0x59);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char)&str,0x2f);
  std::__cxx11::string::substr((ulong)&local_360,(ulong)&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar16 = checkstr(&local_360,&local_3a0,true,0x5a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_index._M_dataplus._M_p != &rec.m_index.field_2) {
    operator_delete(rec.m_index._M_dataplus._M_p,rec.m_index.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_name._M_dataplus._M_p != &rec.m_name.field_2) {
    operator_delete(rec.m_name._M_dataplus._M_p,rec.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rec.m_group._M_dataplus._M_p != &rec.m_group.field_2) {
    operator_delete(rec.m_group._M_dataplus._M_p,rec.m_group.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  return (uint)(((bVar14 || bVar15) || bVar16) ||
               ((((bVar10 || bVar11) || bVar12) || bVar13) ||
               (((bVar7 || bVar8) || bVar9) || ((bVar5 || bVar6) || (bVar3 || bVar4)))));
}

Assistant:

int main()
{
    int result(0);

    {
        string str("frames/100/log.txt");
        Record rec(str);
        result |= check(rec, "", "log.txt", "100", Discrete, UInt8, Text, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frames/100/log.txt");
        Record rec(str);
        result |= check(rec, "", "lo.txt", "100", Discrete, UInt8, Text, false, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frames/100/position.f32.ind");
        Record rec(str);
        result |= check(rec, "", "position", "100", Discrete, Float32, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("velocity.u64.uni");
        Record rec(str);
        result |= check(rec, "", "velocity", "", Constant, UInt64, Uniform, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("/vars/stdout.txt/12");
        Record rec(str);
        result |= check(rec, "", "stdout.txt", "12", Continuous, UInt8, Text, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("/rigid_body/frames/0/angular_momentum.f64.ind");
        Record rec(str);
        result |= check(rec, "rigid_body", "angular_momentum", "0", Discrete, Float64, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frame/2000/position.f32.ind");
        Record rec(str);
        result |= check(rec, "frame/2000", "position", "", Constant, Float32, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    return result;
}